

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O0

size_t beltFMTCalcB(u32 mod,size_t count)

{
  size_t sVar1;
  word in_RSI;
  uint in_EDI;
  word *t4;
  word *t3;
  word *t2;
  word *t1;
  word *t0;
  word stack [10];
  size_t k;
  word den [2];
  word num [2];
  size_t m;
  size_t in_stack_ffffffffffffff58;
  word *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  word *in_stack_ffffffffffffff70;
  word *in_stack_ffffffffffffff78;
  word *in_stack_ffffffffffffff80;
  word wStack_78;
  void *in_stack_ffffffffffffff90;
  word awStack_68 [3];
  size_t local_50;
  ulong local_48 [2];
  word local_38 [3];
  undefined8 local_20;
  word local_18;
  uint local_c;
  ulong local_8;
  
  local_20 = 2;
  if ((in_EDI == 0xc203) && (in_RSI == 0x140)) {
    local_8 = 0x27;
  }
  else if (in_EDI == 0x10000) {
    local_8 = in_RSI * 0x10 + 0x3f >> 6;
  }
  else {
    local_18 = in_RSI;
    local_c = in_EDI;
    sVar1 = u64CLZ(0x159edc);
    local_50 = -sVar1 + 0x40;
    if (local_c - (1 << ((byte)local_50 - 1 & 0x1f)) < (1 << ((byte)local_50 & 0x1f)) - local_c) {
      local_50 = -sVar1 + 0x3f;
    }
    wwSetZero((word *)&stack0xffffffffffffff58,2);
    wwSetBit((word *)&stack0xffffffffffffff58,local_50 * 3,1);
    wwSetZero((word *)&stack0xffffffffffffff68,2);
    wwSetBit((word *)&stack0xffffffffffffff68,local_50 << 1,1);
    zzMulW((word *)&stack0xffffffffffffff68,(word *)&stack0xffffffffffffff68,2,(ulong)local_c);
    wwSetZero((word *)&stack0xffffffffffffff78,2);
    wwSetBit((word *)&stack0xffffffffffffff78,local_50,1);
    zzMulW((word *)&stack0xffffffffffffff78,(word *)&stack0xffffffffffffff78,2,(ulong)local_c);
    zzMulW((word *)&stack0xffffffffffffff78,(word *)&stack0xffffffffffffff78,2,(ulong)local_c);
    wwSetW(&wStack_78,2,(ulong)local_c);
    zzMulW(&wStack_78,&wStack_78,2,(ulong)local_c);
    zzMulW(&wStack_78,&wStack_78,2,(ulong)local_c);
    wwCopy(local_48,(word *)&stack0xffffffffffffff58,2);
    zzAdd2(local_48,&wStack_78,2);
    wwCopy(awStack_68,(word *)&stack0xffffffffffffff68,2);
    zzAdd2(awStack_68,(word *)&stack0xffffffffffffff78,2);
    zzMulW(awStack_68,awStack_68,2,9);
    zzAdd2(local_48,awStack_68,2);
    wwCopy(local_38,local_48,2);
    zzMulW(local_38,local_38,2,0x129c);
    zzMulW(local_38,local_38,2,local_50);
    zzMulW(&wStack_78,&wStack_78,2,0x6271);
    zzAdd2(local_38,&wStack_78,2);
    zzMulW((word *)&stack0xffffffffffffff78,(word *)&stack0xffffffffffffff78,2,0xf1a1);
    zzAdd2(local_38,(word *)&stack0xffffffffffffff78,2);
    zzMulW((word *)&stack0xffffffffffffff68,(word *)&stack0xffffffffffffff68,2,0xf1a1);
    zzSub2(local_38,(word *)&stack0xffffffffffffff68,2);
    zzMulW((word *)&stack0xffffffffffffff58,(word *)&stack0xffffffffffffff58,2,0x6271);
    zzSub2(local_38,(word *)&stack0xffffffffffffff58,2);
    zzMulW(local_38,local_38,2,local_18);
    zzMulW(local_48,local_48,2,0x300);
    zzMulW(local_48,local_48,2,0x18d);
    zzAdd2(local_38,local_48,2);
    zzSubW2(local_38,2,1);
    for (local_50 = 2; local_48[local_50 + -1] == 0; local_50 = local_50 + -1) {
    }
    zzDiv(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
          in_stack_ffffffffffffff90);
    local_8 = local_48[0];
  }
  return local_8;
}

Assistant:

static size_t beltFMTCalcB(u32 mod, size_t count)
{
	const size_t m = W_OF_B(128);
	word num[W_OF_B(128)];
	word den[W_OF_B(128)];
	size_t k;
	word stack[W_OF_B(128) * 5];
	word* t0 = stack; 
	word* t1 = t0 + m; 
	word* t2 = t1 + m; 
	word* t3 = t2 + m; 
	word* t4 = t3 + m; 
	// pre
	ASSERT(2 <= mod && mod <= 65536);
	ASSERT(1 <= count && count <= 300);
	// обработать особые сочетания (mod, count)
	if (mod == 49667 && count == 320)
		return 39;
	// обработать mod, который не умещается в 16 битов
	if (mod == 65536)
		return (16 * count + 63) / 64;
	// k <- ceil(log2(mod))
	k = B_PER_W - wordCLZ((word)mod);
	ASSERT(k > 0);
	if ((U32_1 << k) - mod > mod - (U32_1 << (k - 1)))
		--k;
	// t0 <- 8^k
	wwSetZero(t0, m);
	wwSetBit(t0, 3 * k, 1);
	// t1 <- 4^k mod 
	wwSetZero(t1, m);
	wwSetBit(t1, 2 * k, 1);
	zzMulW(t1, t1, m, mod);
	// t2 <- 2^k mod^2
	wwSetZero(t2, m);
	wwSetBit(t2, k, 1);
	zzMulW(t2, t2, m, mod);
	zzMulW(t2, t2, m, mod);
	// t3 <- mod^3
	wwSetW(t3, m, mod);
	zzMulW(t3, t3, m, mod);
	zzMulW(t3, t3, m, mod);
	// den <- t0 + 9 * t1 + 9 * t2 + t3
	wwCopy(den, t0, m);
	zzAdd2(den, t3, m);
	wwCopy(t4, t1, m);
	zzAdd2(t4, t2, m);
	zzMulW(t4, t4, m, 9);
	zzAdd2(den, t4, m);
	// num <- den * 4767 k 
	wwCopy(num, den, m);
	zzMulW(num, num, m, 4764);
	zzMulW(num, num, m, (word)k);
	// num <- count * (num - 25201 t0 - 61857 t1 + 61857 t2 + 25201 t3)
	zzMulW(t3, t3, m, 25201);
	zzAdd2(num, t3, m);
	zzMulW(t2, t2, m, 61857u);
	zzAdd2(num, t2, m);
	zzMulW(t1, t1, m, 61857u);
	zzSub2(num, t1, m);
	zzMulW(t0, t0, m, 25201);
	zzSub2(num, t0, m);
	zzMulW(num, num, m, (word)count);
	// den <- 304896 * den
	zzMulW(den, den, m, 768);
	zzMulW(den, den, m, 397);
	// num <- num + den - 1
	zzAdd2(num, den, m);
	zzSubW2(num, m, 1);
	// num <- num / den
	for (k = m; den[k - 1] == 0; --k);
	ASSERT(zzDiv_deep(m, k) <= sizeof(stack));
	zzDiv(den, num, num, m, den, k, stack);
	// возврат
	return (size_t)den[0];
}